

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treemodel.h
# Opt level: O3

void __thiscall TreeModel::TreeModel(TreeModel *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  TreeItem *this_00;
  CBString local_d8;
  CBString local_c0;
  CBString local_a8;
  UByteArray local_90;
  UByteArray local_70;
  UByteArray local_50;
  
  this->markingEnabledFlag = false;
  this->markingDarkModeFlag = false;
  this_00 = (TreeItem *)operator_new(0x118);
  Bstrlib::CBString::CBString(&local_a8);
  Bstrlib::CBString::CBString(&local_c0);
  Bstrlib::CBString::CBString(&local_d8);
  paVar2 = &local_50.d.field_2;
  local_50.d._M_string_length = 0;
  local_50.d.field_2._M_local_buf[0] = '\0';
  paVar3 = &local_70.d.field_2;
  local_70.d._M_string_length = 0;
  local_70.d.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_90.d.field_2;
  local_90.d._M_string_length = 0;
  local_90.d.field_2._M_local_buf[0] = '\0';
  local_90.d._M_dataplus._M_p = (pointer)paVar1;
  local_70.d._M_dataplus._M_p = (pointer)paVar3;
  local_50.d._M_dataplus._M_p = (pointer)paVar2;
  TreeItem::TreeItem(this_00,0,'<','\0',&local_a8,&local_c0,&local_d8,&local_50,&local_70,&local_90,
                     true,false,(TreeItem *)0x0);
  this->rootItem = this_00;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.d._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.d._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.d._M_dataplus._M_p != paVar3) {
    operator_delete(local_70.d._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.d._M_dataplus._M_p != paVar2) {
    operator_delete(local_50.d._M_dataplus._M_p);
  }
  Bstrlib::CBString::~CBString(&local_d8);
  Bstrlib::CBString::~CBString(&local_c0);
  Bstrlib::CBString::~CBString(&local_a8);
  return;
}

Assistant:

TreeModel() : markingEnabledFlag(false), markingDarkModeFlag(false) {
        rootItem = new TreeItem(0, Types::Root, 0, UString(), UString(), UString(), UByteArray(), UByteArray(), UByteArray(), true, false);
    }